

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

string * __thiscall
Debugger::GetFile_abi_cxx11_(string *__return_storage_ptr__,Debugger *this,lua_Debug *ar)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  allocator local_5a;
  allocator local_59;
  char *local_58;
  char *p;
  int result;
  char *file;
  lua_State *L;
  allocator local_21;
  lua_Debug *local_20;
  lua_Debug *ar_local;
  Debugger *this_local;
  
  local_20 = ar;
  ar_local = (lua_Debug *)this;
  this_local = (Debugger *)__return_storage_ptr__;
  if (this->currentL == (lua_State *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    file = (char *)this->currentL;
    _result = getDebugSource(ar);
    iVar2 = getDebugCurrentLine(local_20);
    pcVar1 = _result;
    if (iVar2 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar1,(allocator *)((long)&p + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
    }
    else {
      sVar3 = strlen(_result);
      if ((sVar3 != 0) && (*_result == '@')) {
        _result = _result + 1;
      }
      (*lua_pushcclosure)((lua_State *)file,FixPath,0);
      (*lua_pushstring)((lua_State *)file,_result);
      p._0_4_ = lua_pcall((lua_State *)file,1,1,0);
      if ((int)p == 0) {
        local_58 = (*lua_tolstring)((lua_State *)file,-1,(size_t *)0x0);
        (*lua_settop)((lua_State *)file,-2);
        pcVar1 = local_58;
        if (local_58 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_59);
          std::allocator<char>::~allocator((allocator<char> *)&local_59);
          return __return_storage_ptr__;
        }
      }
      pcVar1 = _result;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_5a);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Debugger::GetFile(lua_Debug *ar) const {
	if (!currentL) {
		return "";
	}

	auto L = currentL;

	const char *file = getDebugSource(ar);
	if (getDebugCurrentLine(ar) < 0)
		return file;
	if (strlen(file) > 0 && file[0] == '@')
		file++;
	lua_pushcclosure(L, FixPath, 0);
	lua_pushstring(L, file);
	const int result = lua_pcall(L, 1, 1, 0);
	if (result == LUA_OK) {
		const auto p = lua_tostring(L, -1);
		lua_pop(L, 1);
		if (p) {
			return p;
		}
	}
	// todo: handle error
	return file;
}